

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O0

void Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>::
     run(long rows,long cols,long depth,double *_lhs,long lhsStride,double *_rhs,long rhsStride,
        ResScalar *_res,long resStride,ResScalar alpha,level3_blocking<double,_double> *blocking,
        GemmParallelInfo<long> *info)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  undefined8 uVar4;
  undefined8 blockA_00;
  long *plVar5;
  ulong size;
  ulong size_00;
  LhsScalar *pLVar6;
  double **ppdVar7;
  long lVar8;
  double *local_3d8;
  double *local_3d0 [5];
  long local_3a8;
  long local_3a0;
  bool local_391;
  double *local_390;
  RhsScalar *local_388;
  RhsScalar *local_380;
  RhsScalar *local_378;
  RhsScalar *local_370;
  RhsScalar *local_368;
  RhsScalar *local_360;
  double *local_358;
  LhsScalar *local_350;
  LhsScalar *local_348;
  blas_data_mapper<double,_long,_0,_0> local_340;
  const_blas_data_mapper<double,_long,_0> local_330;
  long local_320;
  long local_318;
  long actual_nc;
  long j2;
  long local_300;
  long local_2f8;
  long local_2f0;
  long actual_kc;
  long k2;
  long local_2d8;
  long actual_mc;
  long i2;
  undefined1 local_2c0 [7];
  bool pack_rhs_once;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  double *blockB;
  undefined1 local_290 [8];
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  double *blockA;
  size_t sizeB;
  size_t sizeA;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
  gebp;
  gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_0,_false,_false>
  pack_rhs;
  Index IStack_258;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
  pack_lhs;
  long nc;
  long local_240;
  long mc;
  long kc;
  ResMapper res;
  RhsMapper rhs;
  LhsMapper lhs;
  ResScalar alpha_local;
  double *_rhs_local;
  long lhsStride_local;
  double *_lhs_local;
  long depth_local;
  long cols_local;
  long rows_local;
  double *local_1c0;
  long *local_1b8;
  long local_1b0;
  double *local_1a8;
  long *local_1a0;
  long local_198;
  ResScalar *local_190;
  long *local_188;
  ulong local_180;
  ulong local_178;
  long local_170;
  long local_168;
  long *local_160;
  undefined1 local_158 [16];
  double *local_148;
  double *local_140;
  undefined1 *local_138;
  long local_130;
  long local_128;
  long *local_120;
  undefined1 local_118 [16];
  long local_108;
  long local_100;
  undefined1 *local_f8;
  long local_f0;
  long local_e8;
  long *local_e0;
  undefined1 local_d8 [16];
  double *local_c8;
  double *local_c0;
  undefined1 *local_b8;
  long local_b0;
  long local_a8;
  undefined1 *local_a0;
  double *local_98;
  double *local_90;
  undefined1 *local_88;
  long local_80;
  double *local_78;
  long *local_70;
  long local_68;
  double *local_60;
  long *local_58;
  long local_50;
  long local_48;
  long *local_40;
  long local_38;
  long local_30;
  long *local_28;
  long local_20;
  long local_18;
  long *local_10;
  
  ppdVar7 = &local_3d8;
  local_1b8 = &rhs.super_blas_data_mapper<const_double,_long,_0,_0>.m_stride;
  local_1a0 = &res.m_stride;
  local_1b0 = rhsStride;
  local_80 = rhsStride;
  rhs.super_blas_data_mapper<const_double,_long,_0,_0>.m_data = (double *)rhsStride;
  local_188 = &kc;
  local_190 = _res;
  local_198 = resStride;
  kc = (long)_res;
  res.m_data = (double *)resStride;
  _lhs_local = (double *)depth;
  depth_local = cols;
  cols_local = rows;
  rows_local = lhsStride;
  local_1c0 = _lhs;
  local_1a8 = _rhs;
  local_78 = _rhs;
  local_70 = local_1a0;
  local_68 = lhsStride;
  local_60 = _lhs;
  local_58 = local_1b8;
  res.m_stride = (long)_rhs;
  rhs.super_blas_data_mapper<const_double,_long,_0,_0>.m_stride = (long)_lhs;
  mc = level3_blocking<double,_double>::kc(blocking);
  nc = level3_blocking<double,_double>::mc(blocking);
  plVar5 = std::min<long>(&cols_local,&nc);
  local_240 = *plVar5;
  IStack_258 = level3_blocking<double,_double>::nc(blocking);
  plVar5 = std::min<long>(&depth_local,&stack0xfffffffffffffda8);
  lVar1 = *plVar5;
  ignore_unused_variable<Eigen::internal::GemmParallelInfo<long>*>(&info);
  size = mc * local_240;
  size_00 = mc * lVar1;
  local_178 = size;
  if (0x1fffffffffffffff < size) {
    throw_std_bad_alloc();
  }
  pLVar6 = level3_blocking<double,_double>::blockA(blocking);
  if (pLVar6 == (LhsScalar *)0x0) {
    if (size * 8 < 0x20001) {
      lVar2 = -(size * 8 + 0x1e & 0xfffffffffffffff0);
      ppdVar7 = (double **)((long)&local_3d8 + lVar2);
      local_350 = (LhsScalar *)((long)local_3d0 + lVar2);
    }
    else {
      local_350 = (LhsScalar *)aligned_malloc(size * 8);
    }
    local_348 = local_350;
  }
  else {
    local_348 = level3_blocking<double,_double>::blockA(blocking);
    ppdVar7 = &local_3d8;
  }
  blockA_stack_memory_destructor._16_8_ = local_348;
  *(undefined8 *)((long)ppdVar7 + -8) = 0x2011c0;
  pLVar6 = level3_blocking<double,_double>::blockA(blocking);
  if (pLVar6 == (LhsScalar *)0x0) {
    local_358 = (double *)blockA_stack_memory_destructor._16_8_;
  }
  else {
    local_358 = (double *)0x0;
  }
  pdVar3 = local_358;
  *(undefined8 *)((long)ppdVar7 + -8) = 0x201215;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_290,pdVar3,size,0x20000 < size * 8);
  local_180 = size_00;
  if (0x1fffffffffffffff < size_00) {
    *(undefined8 *)((long)ppdVar7 + -8) = 0x20123b;
    throw_std_bad_alloc();
  }
  *(undefined8 *)((long)ppdVar7 + -8) = 0x20124a;
  local_360 = level3_blocking<double,_double>::blockB(blocking);
  if (local_360 == (RhsScalar *)0x0) {
    if (size_00 * 8 < 0x20001) {
      ppdVar7 = (double **)((long)ppdVar7 + -(size_00 * 8 + 0x1e & 0xfffffffffffffff0));
      local_378 = (RhsScalar *)((ulong)((long)ppdVar7 + 0xf) & 0xfffffffffffffff0);
    }
    else {
      *(undefined8 *)((long)ppdVar7 + -8) = 0x2012d6;
      local_380 = (RhsScalar *)aligned_malloc(size_00 * 8);
      local_378 = local_380;
    }
    local_370 = local_378;
  }
  else {
    *(undefined8 *)((long)ppdVar7 + -8) = 0x201269;
    local_370 = level3_blocking<double,_double>::blockB(blocking);
    local_368 = local_370;
  }
  blockB_stack_memory_destructor._16_8_ = local_370;
  *(undefined8 *)((long)ppdVar7 + -8) = 0x201314;
  local_388 = level3_blocking<double,_double>::blockB(blocking);
  if (local_388 == (RhsScalar *)0x0) {
    local_390 = (double *)blockB_stack_memory_destructor._16_8_;
  }
  else {
    local_390 = (double *)0x0;
  }
  pdVar3 = local_390;
  *(undefined8 *)((long)ppdVar7 + -8) = 0x201372;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_2c0,pdVar3,size_00,0x20000 < size_00 * 8)
  ;
  local_391 = false;
  if ((local_240 != cols_local) && (local_391 = false, (double *)mc == _lhs_local)) {
    local_391 = lVar1 == depth_local;
  }
  i2._7_1_ = local_391;
  for (actual_mc = 0; actual_mc < cols_local; actual_mc = local_240 + actual_mc) {
    k2 = actual_mc + local_240;
    *(undefined8 *)((long)ppdVar7 + -8) = 0x201410;
    plVar5 = std::min<long>(&k2,&cols_local);
    local_2d8 = *plVar5 - actual_mc;
    for (actual_kc = 0; actual_kc < (long)_lhs_local; actual_kc = mc + actual_kc) {
      local_2f8 = actual_kc + mc;
      *(undefined8 *)((long)ppdVar7 + -8) = 0x20146b;
      plVar5 = std::min<long>(&local_2f8,(long *)&_lhs_local);
      uVar4 = blockA_stack_memory_destructor._16_8_;
      lVar2 = local_2d8;
      lVar8 = *plVar5 - actual_kc;
      local_2f0 = lVar8;
      local_3d0[4] = (double *)blockA_stack_memory_destructor._16_8_;
      local_120 = &rhs.super_blas_data_mapper<const_double,_long,_0,_0>.m_stride;
      local_128 = actual_mc;
      local_130 = actual_kc;
      local_40 = local_120;
      local_48 = actual_mc;
      local_50 = actual_kc;
      local_100 = rhs.super_blas_data_mapper<const_double,_long,_0,_0>.m_stride +
                  (actual_mc + actual_kc * lhsStride) * 8;
      local_f8 = local_118;
      local_108 = lhsStride;
      local_a0 = local_118;
      local_a8 = local_100;
      local_b0 = lhsStride;
      local_3a8 = local_100;
      local_3a0 = lhsStride;
      j2 = local_100;
      local_300 = lhsStride;
      *(undefined8 *)((long)ppdVar7 + -0x10) = 0;
      *(undefined8 *)((long)ppdVar7 + -0x18) = 0x2015cf;
      gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
      ::operator()((gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
                    *)((long)&sizeA + 7),(double *)uVar4,
                   (const_blas_data_mapper<double,_long,_0> *)&j2,lVar8,lVar2,0,
                   *(long *)((long)ppdVar7 + -0x10));
      for (actual_nc = 0; actual_nc < depth_local; actual_nc = lVar1 + actual_nc) {
        local_320 = actual_nc + lVar1;
        *(undefined8 *)((long)ppdVar7 + -8) = 0x20161c;
        plVar5 = std::min<long>(&local_320,&depth_local);
        uVar4 = blockB_stack_memory_destructor._16_8_;
        lVar2 = local_2f0;
        lVar8 = *plVar5 - actual_nc;
        local_318 = lVar8;
        if (((i2._7_1_ & 1) == 0) || (actual_mc == 0)) {
          local_3d0[1] = (double *)blockB_stack_memory_destructor._16_8_;
          local_160 = &res.m_stride;
          local_168 = actual_kc;
          local_170 = actual_nc;
          local_28 = &res.m_stride;
          local_30 = actual_kc;
          local_38 = actual_nc;
          local_140 = (double *)
                      (res.m_stride +
                      (actual_kc +
                      actual_nc * (long)rhs.super_blas_data_mapper<const_double,_long,_0,_0>.m_data)
                      * 8);
          local_138 = local_158;
          local_148 = rhs.super_blas_data_mapper<const_double,_long,_0,_0>.m_data;
          local_88 = local_158;
          local_90 = local_140;
          local_98 = rhs.super_blas_data_mapper<const_double,_long,_0,_0>.m_data;
          local_3d0[2] = local_140;
          local_3d0[3] = rhs.super_blas_data_mapper<const_double,_long,_0,_0>.m_data;
          local_330.super_blas_data_mapper<const_double,_long,_0,_0>.m_data = local_140;
          local_330.super_blas_data_mapper<const_double,_long,_0,_0>.m_stride =
               (long)rhs.super_blas_data_mapper<const_double,_long,_0,_0>.m_data;
          *(undefined8 *)((long)ppdVar7 + -0x10) = 0;
          *(undefined8 *)((long)ppdVar7 + -0x18) = 0x20178e;
          gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_0,_false,_false>
          ::operator()((gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_0,_false,_false>
                        *)((long)&sizeA + 6),(double *)uVar4,&local_330,lVar2,lVar8,0,
                       *(long *)((long)ppdVar7 + -0x10));
        }
        blockA_00 = blockA_stack_memory_destructor._16_8_;
        uVar4 = blockB_stack_memory_destructor._16_8_;
        lVar8 = local_2d8;
        lVar2 = local_2f0;
        local_e0 = &kc;
        local_e8 = actual_mc;
        local_f0 = actual_nc;
        local_10 = &kc;
        local_18 = actual_mc;
        local_20 = actual_nc;
        local_c0 = (double *)(kc + (actual_mc + actual_nc * (long)res.m_data) * 8);
        local_b8 = local_d8;
        local_c8 = res.m_data;
        local_3d8 = local_c0;
        local_3d0[0] = res.m_data;
        local_340.m_data = local_c0;
        local_340.m_stride = (long)res.m_data;
        *(long *)((long)ppdVar7 + -0x30) = local_318;
        *(undefined8 *)((long)ppdVar7 + -0x10) = 0;
        *(undefined8 *)((long)ppdVar7 + -0x18) = 0;
        *(undefined8 *)((long)ppdVar7 + -0x20) = 0xffffffffffffffff;
        *(undefined8 *)((long)ppdVar7 + -0x28) = 0xffffffffffffffff;
        *(undefined8 *)((long)ppdVar7 + -0x38) = 0x201915;
        gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
        ::operator()((gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
                      *)((long)&sizeA + 5),&local_340,(double *)blockA_00,(double *)uVar4,lVar8,
                     lVar2,*(long *)((long)ppdVar7 + -0x30),alpha,*(long *)((long)ppdVar7 + -0x28),
                     *(long *)((long)ppdVar7 + -0x20),*(long *)((long)ppdVar7 + -0x18),
                     *(long *)((long)ppdVar7 + -0x10));
      }
    }
  }
  *(undefined8 *)((long)ppdVar7 + -8) = 0x20197b;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_2c0);
  *(undefined8 *)((long)ppdVar7 + -8) = 0x201987;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_290);
  return;
}

Assistant:

static void run(Index rows, Index cols, Index depth,
  const LhsScalar* _lhs, Index lhsStride,
  const RhsScalar* _rhs, Index rhsStride,
  ResScalar* _res, Index resStride,
  ResScalar alpha,
  level3_blocking<LhsScalar,RhsScalar>& blocking,
  GemmParallelInfo<Index>* info = 0)
{
  typedef const_blas_data_mapper<LhsScalar, Index, LhsStorageOrder> LhsMapper;
  typedef const_blas_data_mapper<RhsScalar, Index, RhsStorageOrder> RhsMapper;
  typedef blas_data_mapper<typename Traits::ResScalar, Index, ColMajor> ResMapper;
  LhsMapper lhs(_lhs,lhsStride);
  RhsMapper rhs(_rhs,rhsStride);
  ResMapper res(_res, resStride);

  Index kc = blocking.kc();                   // cache block size along the K direction
  Index mc = (std::min)(rows,blocking.mc());  // cache block size along the M direction
  Index nc = (std::min)(cols,blocking.nc());  // cache block size along the N direction

  gemm_pack_lhs<LhsScalar, Index, LhsMapper, Traits::mr, Traits::LhsProgress, LhsStorageOrder> pack_lhs;
  gemm_pack_rhs<RhsScalar, Index, RhsMapper, Traits::nr, RhsStorageOrder> pack_rhs;
  gebp_kernel<LhsScalar, RhsScalar, Index, ResMapper, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs> gebp;

#ifdef EIGEN_HAS_OPENMP
  if(info)
  {
    // this is the parallel version!
    int tid = omp_get_thread_num();
    int threads = omp_get_num_threads();

    LhsScalar* blockA = blocking.blockA();
    eigen_internal_assert(blockA!=0);

    std::size_t sizeB = kc*nc;
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockB, sizeB, 0);

    // For each horizontal panel of the rhs, and corresponding vertical panel of the lhs...
    for(Index k=0; k<depth; k+=kc)
    {
      const Index actual_kc = (std::min)(k+kc,depth)-k; // => rows of B', and cols of the A'

      // In order to reduce the chance that a thread has to wait for the other,
      // let's start by packing B'.
      pack_rhs(blockB, rhs.getSubMapper(k,0), actual_kc, nc);

      // Pack A_k to A' in a parallel fashion:
      // each thread packs the sub block A_k,i to A'_i where i is the thread id.

      // However, before copying to A'_i, we have to make sure that no other thread is still using it,
      // i.e., we test that info[tid].users equals 0.
      // Then, we set info[tid].users to the number of threads to mark that all other threads are going to use it.
      while(info[tid].users!=0) {}
      info[tid].users += threads;

      pack_lhs(blockA+info[tid].lhs_start*actual_kc, lhs.getSubMapper(info[tid].lhs_start,k), actual_kc, info[tid].lhs_length);

      // Notify the other threads that the part A'_i is ready to go.
      info[tid].sync = k;

      // Computes C_i += A' * B' per A'_i
      for(int shift=0; shift<threads; ++shift)
      {
        int i = (tid+shift)%threads;

        // At this point we have to make sure that A'_i has been updated by the thread i,
        // we use testAndSetOrdered to mimic a volatile access.
        // However, no need to wait for the B' part which has been updated by the current thread!
        if (shift>0) {
          while(info[i].sync!=k) {
          }
        }

        gebp(res.getSubMapper(info[i].lhs_start, 0), blockA+info[i].lhs_start*actual_kc, blockB, info[i].lhs_length, actual_kc, nc, alpha);
      }

      // Then keep going as usual with the remaining B'
      for(Index j=nc; j<cols; j+=nc)
      {
        const Index actual_nc = (std::min)(j+nc,cols)-j;

        // pack B_k,j to B'
        pack_rhs(blockB, rhs.getSubMapper(k,j), actual_kc, actual_nc);

        // C_j += A' * B'
        gebp(res.getSubMapper(0, j), blockA, blockB, rows, actual_kc, actual_nc, alpha);
      }

      // Release all the sub blocks A'_i of A' for the current thread,
      // i.e., we simply decrement the number of users by 1
      for(Index i=0; i<threads; ++i)
        #pragma omp atomic
        info[i].users -= 1;
    }
  }
  else
#endif // EIGEN_HAS_OPENMP
  {
    EIGEN_UNUSED_VARIABLE(info);

    // this is the sequential version!
    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*nc;

    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockB, sizeB, blocking.blockB());

    const bool pack_rhs_once = mc!=rows && kc==depth && nc==cols;

    // For each horizontal panel of the rhs, and corresponding panel of the lhs...
    for(Index i2=0; i2<rows; i2+=mc)
    {
      const Index actual_mc = (std::min)(i2+mc,rows)-i2;

      for(Index k2=0; k2<depth; k2+=kc)
      {
        const Index actual_kc = (std::min)(k2+kc,depth)-k2;

        // OK, here we have selected one horizontal panel of rhs and one vertical panel of lhs.
        // => Pack lhs's panel into a sequential chunk of memory (L2/L3 caching)
        // Note that this panel will be read as many times as the number of blocks in the rhs's
        // horizontal panel which is, in practice, a very low number.
        pack_lhs(blockA, lhs.getSubMapper(i2,k2), actual_kc, actual_mc);

        // For each kc x nc block of the rhs's horizontal panel...
        for(Index j2=0; j2<cols; j2+=nc)
        {
          const Index actual_nc = (std::min)(j2+nc,cols)-j2;

          // We pack the rhs's block into a sequential chunk of memory (L2 caching)
          // Note that this block will be read a very high number of times, which is equal to the number of
          // micro horizontal panel of the large rhs's panel (e.g., rows/12 times).
          if((!pack_rhs_once) || i2==0)
            pack_rhs(blockB, rhs.getSubMapper(k2,j2), actual_kc, actual_nc);

          // Everything is packed, we can now call the panel * block kernel:
          gebp(res.getSubMapper(i2, j2), blockA, blockB, actual_mc, actual_kc, actual_nc, alpha);
        }
      }
    }
  }
}